

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O2

AddressFactory * __thiscall
cfd::AddressFactory::GetAddressByLockingScript(AddressFactory *this,Script *locking_script)

{
  char cVar1;
  ScriptOperator *this_00;
  CfdException *this_01;
  undefined1 auStack_a8 [8];
  Pubkey pubkey;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  cfd::core::Script::GetElementList();
  cVar1 = cfd::core::Script::IsP2pkScript();
  if (cVar1 == '\0') {
    cVar1 = cfd::core::Script::IsP2pkhScript();
    if (cVar1 == '\0') {
      cVar1 = cfd::core::Script::IsP2shScript();
      if (cVar1 == '\0') {
        cVar1 = cfd::core::Script::IsP2wpkhScript();
        if (cVar1 == '\0') {
          cVar1 = cfd::core::Script::IsP2wshScript();
          if (cVar1 == '\0') {
            cVar1 = cfd::core::Script::IsTaprootScript();
            if (cVar1 == '\0') {
              cVar1 = cfd::core::Script::IsWitnessProgram();
              if (cVar1 != '\0') {
                this_00 = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
                cVar1 = cfd::core::ScriptOperator::operator!=
                                  (this_00,(ScriptOperator *)&core::ScriptOperator::OP_0);
                if (cVar1 != '\0') {
                  cfd::core::ScriptElement::GetOpCode();
                  cfd::core::ScriptElement::GetBinaryData();
                  GetSegwitAddressByHash(this,(ByteData *)locking_script,(WitnessVersion)&pubkey);
                  goto LAB_0021866f;
                }
              }
              cVar1 = cfd::core::Script::IsMultisigScript();
              this_01 = (CfdException *)__cxa_allocate_exception(0x30);
              if (cVar1 != '\0') {
                std::__cxx11::string::string
                          ((string *)&pubkey,"script type is multisig script.",
                           (allocator *)&local_68);
                core::CfdException::CfdException(this_01,kCfdIllegalArgumentError,(string *)&pubkey)
                ;
                __cxa_throw(this_01,&core::CfdException::typeinfo,core::CfdException::~CfdException)
                ;
              }
              std::__cxx11::string::string
                        ((string *)&pubkey,"unknown type locking script.",(allocator *)&local_68);
              core::CfdException::CfdException(this_01,kCfdIllegalArgumentError,(string *)&pubkey);
              __cxa_throw(this_01,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            cfd::core::ScriptElement::GetBinaryData();
            GetSegwitAddressByHash(this,(ByteData *)locking_script,(WitnessVersion)&pubkey);
            goto LAB_0021866f;
          }
        }
        cfd::core::ScriptElement::GetBinaryData();
        GetSegwitAddressByHash(this,(ByteData *)locking_script);
      }
      else {
        cfd::core::ScriptElement::GetBinaryData();
        cfd::core::ByteData::GetBytes();
        cfd::core::ByteData160::ByteData160((ByteData160 *)&pubkey,(vector *)&local_68);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
        GetAddressByHash(this,(AddressType)locking_script,(ByteData160 *)0x1);
      }
    }
    else {
      cfd::core::ScriptElement::GetBinaryData();
      cfd::core::ByteData::GetBytes();
      cfd::core::ByteData160::ByteData160((ByteData160 *)&pubkey,(vector *)&local_68);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
      GetAddressByHash(this,(AddressType)locking_script,(ByteData160 *)0x2);
    }
  }
  else {
    cfd::core::ScriptElement::GetBinaryData();
    cfd::core::Pubkey::Pubkey(&pubkey,_auStack_a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    CreateP2pkhAddress(this,(Pubkey *)locking_script);
  }
LAB_0021866f:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector(&items);
  return this;
}

Assistant:

Address AddressFactory::GetAddressByLockingScript(
    const Script& locking_script) const {
  std::vector<ScriptElement> items = locking_script.GetElementList();
  if (locking_script.IsP2pkScript()) {
    Pubkey pubkey = Pubkey(items[0].GetBinaryData());
    return CreateP2pkhAddress(pubkey);
  } else if (locking_script.IsP2pkhScript()) {
    ByteData160 hash = ByteData160(items[2].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2pkhAddress, hash);
  } else if (locking_script.IsP2shScript()) {
    ByteData160 hash = ByteData160(items[1].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2shAddress, hash);
  } else if (
      locking_script.IsP2wpkhScript() || locking_script.IsP2wshScript()) {
    return GetSegwitAddressByHash(items[1].GetBinaryData());
  } else if (locking_script.IsTaprootScript()) {
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), WitnessVersion::kVersion1);
  } else if (
      locking_script.IsWitnessProgram() &&
      (items[0].GetOpCode() != ScriptOperator::OP_0)) {
    uint8_t var = items[0].GetOpCode().GetDataType() - ScriptType::kOp_1;
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), static_cast<WitnessVersion>(var + 1));
  } else if (locking_script.IsMultisigScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "script type is multisig script.");
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "unknown type locking script.");
  }
}